

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# late_materialization.cpp
# Opt level: O2

bool __thiscall
duckdb::LateMaterialization::TryLateMaterialization
          (LateMaterialization *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  LogicalType *this_00;
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  LogicalOperatorType LVar4;
  pointer pCVar5;
  pointer pCVar6;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var7;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> _Var8;
  undefined8 uVar9;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> uVar10;
  int iVar11;
  type pLVar12;
  pointer pLVar13;
  reference pvVar14;
  LogicalProjection *pLVar15;
  _Base_ptr p_Var16;
  LogicalGet *this_01;
  vector<duckdb::ColumnIndex,_true> *pvVar17;
  iterator iVar18;
  type this_02;
  reference pvVar19;
  pointer pEVar20;
  ulong uVar21;
  LogicalTopN *pLVar22;
  idx_t iVar23;
  idx_t iVar24;
  pointer pLVar25;
  pointer pLVar26;
  type expr_00;
  pointer pLVar27;
  InternalException *this_03;
  bool bVar28;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_1;
  pointer puVar29;
  ulong uVar30;
  long lVar31;
  pointer pBVar32;
  pointer pBVar33;
  pointer *__ptr;
  type pLVar34;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  __node_base *p_Var35;
  pointer puVar36;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_168;
  _Head_base<0UL,_duckdb::LogicalComparisonJoin_*,_false> local_160;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *local_158
  ;
  reference<LogicalOperator> child;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
  local_140;
  undefined1 local_138 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> referenced_columns;
  Optimizer *pOStack_f8;
  undefined1 local_f0 [16];
  bool local_e0;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_true> source_operators;
  idx_t proj_index;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  final_proj_list;
  JoinCondition condition;
  vector<duckdb::BoundOrderByNode,_true> final_orders;
  ColumnBinding rhs_binding;
  column_binding_map_t<ReferencedColumn> *__range4;
  ColumnBinding lhs_binding;
  
  source_operators.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  source_operators.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  source_operators.
  super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158 = op;
  pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(op);
  LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)this,pLVar12);
  pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(local_158);
  pvVar14 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
            ::get<true>(&pLVar13->children,0);
  child._M_data =
       unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
       operator*(pvVar14);
  p_Var1 = &referenced_columns._M_t._M_impl.super__Rb_tree_header;
  do {
    while (LVar4 = (child._M_data)->type, LVar4 != LOGICAL_PROJECTION) {
      if (LVar4 != LOGICAL_FILTER) {
        if (LVar4 == LOGICAL_GET) {
          this_01 = LogicalOperator::Cast<duckdb::LogicalGet>(child._M_data);
          uVar30 = (this->super_BaseColumnPruner).column_references._M_h._M_element_count;
          pvVar17 = LogicalGet::GetColumnIds(this_01);
          if ((uVar30 < (ulong)((long)(pvVar17->
                                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ).
                                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pvVar17->
                                      super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ).
                                      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5)) &&
             ((this_01->function).late_materialization == true)) {
            iVar18 = ::std::
                     _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::TableColumn>,_std::allocator<std::pair<const_unsigned_long,_duckdb::TableColumn>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&(this_01->virtual_columns)._M_h,&COLUMN_IDENTIFIER_ROW_ID);
            if (iVar18.
                super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                ._M_cur == (__node_type *)0x0) {
              this_03 = (InternalException *)__cxa_allocate_exception(0x10);
              ::std::__cxx11::string::string
                        ((string *)&referenced_columns,
                         "Table function supports late materialization but does not expose a rowid column"
                         ,(allocator *)&final_proj_list);
              InternalException::InternalException(this_03,(string *)&referenced_columns);
              __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            this_00 = &this->row_id_type;
            LogicalType::operator=
                      (this_00,(LogicalType *)
                               ((long)iVar18.
                                      super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::TableColumn>,_false>
                                      ._M_cur + 0x30));
            ConstructLHS((LateMaterialization *)local_138,(LogicalGet *)this);
            this_02 = unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                      ::operator*((unique_ptr<duckdb::LogicalGet,_std::default_delete<duckdb::LogicalGet>,_true>
                                   *)local_138);
            iVar23 = this_02->table_index;
            pvVar17 = LogicalGet::GetColumnIds(this_02);
            pCVar5 = (pvVar17->
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pCVar6 = (pvVar17->
                     super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>).
                     super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pLVar34 = this_02;
            lhs_binding.column_index = GetOrInsertRowId(this,this_02);
            final_proj_list.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            final_proj_list.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            final_proj_list.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            lhs_binding.table_index = iVar23;
            if (source_operators.
                super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                source_operators.
                super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                .
                super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              for (lVar31 = 0; (long)pCVar5 - (long)pCVar6 >> 5 != lVar31; lVar31 = lVar31 + 1) {
                GetExpression((LateMaterialization *)&referenced_columns,
                              &pLVar34->super_LogicalOperator,(idx_t)this_02);
                pLVar34 = (type)&referenced_columns;
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&final_proj_list,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&referenced_columns);
                if (referenced_columns._M_t._M_impl._0_8_ != 0) {
                  (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
                }
              }
            }
            else {
              pvVar19 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::get<true>
                                  (&source_operators,0);
              puVar36 = (pvVar19->_M_data->expressions).
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (puVar29 = (pvVar19->_M_data->expressions).
                             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; puVar29 != puVar36;
                  puVar29 = puVar29 + 1) {
                pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(puVar29);
                (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])
                          (&referenced_columns,pEVar20);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&final_proj_list,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&referenced_columns);
                if (referenced_columns._M_t._M_impl._0_8_ != 0) {
                  (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
                }
              }
              uVar30 = 0;
              while( true ) {
                uVar21 = (long)source_operators.
                               super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                               .
                               super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)source_operators.
                               super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                               .
                               super__Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3;
                if (uVar21 <= uVar30) break;
                uVar30 = uVar30 + 1;
                pLVar34 = this_02;
                if (uVar30 < uVar21) {
                  pvVar19 = vector<std::reference_wrapper<duckdb::LogicalOperator>,_true>::get<true>
                                      (&source_operators,uVar30);
                  pLVar34 = (type)pvVar19->_M_data;
                }
                puVar29 = final_proj_list.
                          super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (puVar36 = final_proj_list.
                               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_start; puVar36 != puVar29;
                    puVar36 = puVar36 + 1) {
                  ReplaceExpressionReferences(this,&pLVar34->super_LogicalOperator,puVar36);
                }
              }
            }
            final_orders.
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            final_orders.
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            final_orders.
            super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator->(local_158);
            LVar4 = pLVar13->type;
            if (LVar4 == LOGICAL_TOP_N) {
              pLVar13 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        ::operator->(local_158);
              pLVar22 = LogicalOperator::Cast<duckdb::LogicalTopN>(pLVar13);
              pBVar33 = (pLVar22->orders).
                        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        .
                        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pBVar32 = (pLVar22->orders).
                             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             .
                             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_start; pBVar32 != pBVar33;
                  pBVar32 = pBVar32 + 1) {
                pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator->(&pBVar32->expression);
                (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])
                          (&referenced_columns,pEVar20);
                ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
                emplace_back<duckdb::OrderType&,duckdb::OrderByNullType&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>
                            *)&final_orders,&pBVar32->type,&pBVar32->null_order,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&referenced_columns);
                if (referenced_columns._M_t._M_impl._0_8_ != 0) {
                  (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
                }
              }
            }
            else {
              make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                        ((duckdb *)&referenced_columns,(char (*) [6])0x1fb6934,this_00,&lhs_binding)
              ;
              condition.left.
              super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
              super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
              _M_t.
              super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
              .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 2;
              rhs_binding.table_index._0_1_ = 3;
              ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
              emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<duckdb::BoundColumnRefExpression>,true>>
                        ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>
                          *)&final_orders,(OrderType *)&condition,(OrderByNullType *)&rhs_binding,
                         (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                          *)&referenced_columns);
              if (referenced_columns._M_t._M_impl._0_8_ != 0) {
                (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
              }
            }
            rhs_binding = ConstructRHS(this,local_158);
            iVar23 = rhs_binding.table_index;
            iVar24 = Binder::GenerateTableIndex(this->optimizer->binder);
            rhs_binding.table_index = iVar24;
            pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator*(local_158);
            ReplaceTopLevelTableIndex(this,pLVar12,rhs_binding.table_index);
            referenced_columns._M_t._M_impl._0_1_ = 5;
            make_uniq<duckdb::LogicalComparisonJoin,duckdb::JoinType>
                      ((duckdb *)&local_160,(JoinType *)&referenced_columns);
            pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_160);
            referenced_columns._M_t._M_impl._0_8_ = local_138;
            local_138 = (undefined1  [8])0x0;
            ::std::
            vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                        *)&(pLVar25->super_LogicalJoin).super_LogicalOperator.children,
                       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&referenced_columns);
            if (referenced_columns._M_t._M_impl._0_8_ != 0) {
              (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
            }
            pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_160);
            ::std::
            vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                        *)&(pLVar25->super_LogicalJoin).super_LogicalOperator.children,local_158);
            condition.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0;
            condition.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)0x0;
            condition.comparison = COMPARE_BOUNDARY_START;
            make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                      ((duckdb *)&referenced_columns,(char (*) [6])0x1fb6934,this_00,&lhs_binding);
            uVar9 = referenced_columns._M_t._M_impl._0_8_;
            referenced_columns._M_t._M_impl._0_8_ = 0;
            uVar10.super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
            _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 condition.left.
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            condition.left.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)uVar9;
            if ((uVar10.
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                 (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0) &&
               ((**(code **)(*(long *)uVar10.
                                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                      .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                      _M_head_impl + 8))(),
               referenced_columns._M_t._M_impl._0_8_ != 0)) {
              (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
            }
            make_uniq<duckdb::BoundColumnRefExpression,char_const(&)[6],duckdb::LogicalType&,duckdb::ColumnBinding&>
                      ((duckdb *)&referenced_columns,(char (*) [6])0x1fb6934,this_00,&rhs_binding);
            uVar10 = condition.right;
            condition.right.
            super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
                 referenced_columns._M_t._M_impl._0_8_;
            referenced_columns._M_t._M_impl._0_8_ = 0;
            if ((uVar10.
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
                 .
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
                 (__uniq_ptr_data<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true,_true>
                  )0x0) &&
               ((**(code **)(*(long *)uVar10.
                                      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                      .super__Head_base<0UL,_duckdb::Expression_*,_false>.
                                      _M_head_impl + 8))(),
               referenced_columns._M_t._M_impl._0_8_ != 0)) {
              (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
            }
            pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                      ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                    *)&local_160);
            ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
            emplace_back<duckdb::JoinCondition>
                      (&(pLVar25->conditions).
                        super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
                       &condition);
            proj_index = iVar23;
            if (LVar4 == LOGICAL_TOP_N) {
              make_uniq<duckdb::LogicalProjection,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                        ((duckdb *)&referenced_columns,&proj_index,&final_proj_list);
              pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                      *)&local_160);
              if ((pLVar25->super_LogicalJoin).super_LogicalOperator.has_estimated_cardinality ==
                  true) {
                pLVar26 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                        *)&referenced_columns);
                pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                        *)&local_160);
                LogicalOperator::SetEstimatedCardinality
                          (&pLVar26->super_LogicalOperator,
                           (pLVar25->super_LogicalJoin).super_LogicalOperator.estimated_cardinality)
                ;
              }
              pLVar26 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                      *)&referenced_columns);
              local_168._M_head_impl = local_160._M_head_impl;
              local_160._M_head_impl = (LogicalComparisonJoin *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                          *)&(pLVar26->super_LogicalOperator).children,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_168);
              if (local_168._M_head_impl != (LogicalComparisonJoin *)0x0) {
                (*((local_168._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
                  _vptr_LogicalOperator[1])();
              }
              pBVar32 = final_orders.
                        super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        .
                        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (pBVar33 = final_orders.
                             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             .
                             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                             ._M_impl.super__Vector_impl_data._M_start; pBVar33 != pBVar32;
                  pBVar33 = pBVar33 + 1) {
                expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          ::operator*(&pBVar33->expression);
                ReplaceTableReferences(this,expr_00,proj_index);
              }
              make_uniq<duckdb::LogicalOrder,duckdb::vector<duckdb::BoundOrderByNode,true>>
                        ((duckdb *)&local_168,&final_orders);
              pLVar26 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                      *)&referenced_columns);
              if ((pLVar26->super_LogicalOperator).has_estimated_cardinality == true) {
                pLVar27 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                        *)&local_168);
                pLVar26 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                        *)&referenced_columns);
                LogicalOperator::SetEstimatedCardinality
                          (&pLVar27->super_LogicalOperator,
                           (pLVar26->super_LogicalOperator).estimated_cardinality);
              }
              pLVar27 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                      *)&local_168);
              local_140.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                   (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
                   (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
                   referenced_columns._M_t._M_impl._0_8_;
              referenced_columns._M_t._M_impl._0_8_ = 0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                          *)&(pLVar27->super_LogicalOperator).children,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_140);
            }
            else {
              make_uniq<duckdb::LogicalOrder,duckdb::vector<duckdb::BoundOrderByNode,true>>
                        ((duckdb *)&referenced_columns,&final_orders);
              pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                      *)&local_160);
              if ((pLVar25->super_LogicalJoin).super_LogicalOperator.has_estimated_cardinality ==
                  true) {
                pLVar27 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                        *)&referenced_columns);
                pLVar25 = unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalComparisonJoin,_std::default_delete<duckdb::LogicalComparisonJoin>,_true>
                                        *)&local_160);
                LogicalOperator::SetEstimatedCardinality
                          (&pLVar27->super_LogicalOperator,
                           (pLVar25->super_LogicalJoin).super_LogicalOperator.estimated_cardinality)
                ;
              }
              pLVar27 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                      *)&referenced_columns);
              local_168._M_head_impl = local_160._M_head_impl;
              local_160._M_head_impl = (LogicalComparisonJoin *)0x0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                          *)&(pLVar27->super_LogicalOperator).children,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_168);
              if (local_168._M_head_impl != (LogicalComparisonJoin *)0x0) {
                (*((local_168._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
                  _vptr_LogicalOperator[1])();
              }
              make_uniq<duckdb::LogicalProjection,unsigned_long&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                        ((duckdb *)&local_168,&proj_index,&final_proj_list);
              pLVar27 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                      *)&referenced_columns);
              if ((pLVar27->super_LogicalOperator).has_estimated_cardinality == true) {
                pLVar26 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                        *)&local_168);
                pLVar27 = unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                          ::operator->((unique_ptr<duckdb::LogicalOrder,_std::default_delete<duckdb::LogicalOrder>,_true>
                                        *)&referenced_columns);
                LogicalOperator::SetEstimatedCardinality
                          (&pLVar26->super_LogicalOperator,
                           (pLVar27->super_LogicalOperator).estimated_cardinality);
              }
              pLVar26 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                        ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                                      *)&local_168);
              local_140.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                   (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
                   (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
                   referenced_columns._M_t._M_impl._0_8_;
              referenced_columns._M_t._M_impl._0_8_ = 0;
              ::std::
              vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
              ::
              emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                          *)&(pLVar26->super_LogicalOperator).children,
                         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                          *)&local_140);
            }
            if (local_140.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
                (LogicalOperator *)0x0) {
              (**(code **)(*(long *)local_140.
                                    super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                    _M_head_impl + 8))();
            }
            _Var8._M_head_impl = local_168._M_head_impl;
            local_168._M_head_impl = (LogicalComparisonJoin *)0x0;
            _Var7._M_head_impl =
                 (local_158->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
            (local_158->
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
                 (LogicalOperator *)_Var8._M_head_impl;
            if ((_Var7._M_head_impl != (LogicalOperator *)0x0) &&
               ((**(code **)((long)(_Var7._M_head_impl)->_vptr_LogicalOperator + 8))(),
               local_168._M_head_impl != (LogicalComparisonJoin *)0x0)) {
              (*((local_168._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
                _vptr_LogicalOperator[1])();
            }
            if (referenced_columns._M_t._M_impl._0_8_ != 0) {
              (**(code **)(*(long *)referenced_columns._M_t._M_impl._0_8_ + 8))();
            }
            referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = &pOStack_f8;
            referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                 (_Base_ptr)0x1;
            uVar2 = this->optimizer->context;
            uVar3 = this->optimizer->binder;
            referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0
            ;
            referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 (_Base_ptr)0x0;
            referenced_columns._M_t._M_impl.super__Rb_tree_header._M_node_count =
                 CONCAT44(referenced_columns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,
                          0x3f800000);
            pOStack_f8 = (Optimizer *)0x0;
            referenced_columns._M_t._M_impl._0_8_ = &PTR__BaseColumnPruner_0278c4d8;
            local_f0._8_4_ = (int)uVar2;
            local_f0._0_8_ = uVar3;
            local_f0._12_4_ = (int)((ulong)uVar2 >> 0x20);
            local_e0 = true;
            pLVar12 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                      ::operator*(local_158);
            RemoveUnusedColumns::VisitOperator((RemoveUnusedColumns *)&referenced_columns,pLVar12);
            BaseColumnPruner::~BaseColumnPruner((BaseColumnPruner *)&referenced_columns);
            JoinCondition::~JoinCondition(&condition);
            if (local_160._M_head_impl != (LogicalComparisonJoin *)0x0) {
              (*((local_160._M_head_impl)->super_LogicalJoin).super_LogicalOperator.
                _vptr_LogicalOperator[1])();
            }
            ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
            ~vector(&final_orders.
                     super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                   );
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ::~vector(&final_proj_list.
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     );
            if (local_138 != (undefined1  [8])0x0) {
              (**(code **)(*(_func_int **)local_138 + 8))();
            }
            bVar28 = true;
            goto LAB_0125b434;
          }
        }
        goto LAB_0125b432;
      }
      LogicalOperatorVisitor::VisitOperatorExpressions((LogicalOperatorVisitor *)this,child._M_data)
      ;
      pvVar14 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::get<true>(&(child._M_data)->children,0);
      child._M_data =
           unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(pvVar14);
    }
    pLVar15 = LogicalOperator::Cast<duckdb::LogicalProjection>(child._M_data);
    ::std::
    vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
    ::push_back(&source_operators.
                 super_vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                ,&child);
    puVar29 = (pLVar15->super_LogicalOperator).expressions.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar36 = (pLVar15->super_LogicalOperator).expressions.
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while (puVar29 != puVar36) {
      pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar29);
      iVar11 = (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0xc])(pEVar20);
      puVar29 = puVar29 + 1;
      if ((char)iVar11 != '\0') {
LAB_0125b432:
        bVar28 = false;
LAB_0125b434:
        ::std::
        _Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
                         *)&source_operators);
        return bVar28;
      }
    }
    referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    referenced_columns._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    p_Var35 = &(this->super_BaseColumnPruner).column_references._M_h._M_before_begin;
    referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    while (p_Var35 = p_Var35->_M_nxt, p_Var35 != (__node_base *)0x0) {
      if (p_Var35[1]._M_nxt == (_Hash_node_base *)pLVar15->table_index) {
        ::std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&referenced_columns,(unsigned_long *)(p_Var35 + 2));
      }
    }
    ::std::
    _Hashtable<duckdb::ColumnBinding,_std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>,_std::allocator<std::pair<const_duckdb::ColumnBinding,_duckdb::ReferencedColumn>_>,_std::__detail::_Select1st,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear(&(this->super_BaseColumnPruner).column_references._M_h);
    for (p_Var16 = referenced_columns._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var16 != p_Var1;
        p_Var16 = (_Base_ptr)::std::_Rb_tree_increment(p_Var16)) {
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
      ::get<true>(&(pLVar15->super_LogicalOperator).expressions,*(size_type *)(p_Var16 + 1));
      (*(this->super_BaseColumnPruner).super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor[3])
                (this);
    }
    pvVar14 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::get<true>(&(child._M_data)->children,0);
    child._M_data =
         unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
         operator*(pvVar14);
    ::std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&referenced_columns._M_t);
  } while( true );
}

Assistant:

bool LateMaterialization::TryLateMaterialization(unique_ptr<LogicalOperator> &op) {
	// check if we can benefit from late materialization
	// we need to see how many columns we require in the pipeline versus how many columns we emit in the scan
	// for example, in a query like SELECT * FROM tbl ORDER BY ts LIMIT 5, the top-n only needs the "ts" column
	// the other columns can be fetched later on using late materialization
	// we can only push late materialization through a subset of operators
	// and we can only do it for scans that support the row-id pushdown (currently only DuckDB table scans)

	// visit the expressions for each operator in the chain
	vector<reference<LogicalOperator>> source_operators;

	VisitOperatorExpressions(*op);
	reference<LogicalOperator> child = *op->children[0];
	while (child.get().type != LogicalOperatorType::LOGICAL_GET) {
		switch (child.get().type) {
		case LogicalOperatorType::LOGICAL_PROJECTION: {
			// recurse into the child node - but ONLY visit expressions that are referenced
			auto &proj = child.get().Cast<LogicalProjection>();
			source_operators.push_back(child);

			for (auto &expr : proj.expressions) {
				if (expr->IsVolatile()) {
					// we cannot do this optimization if any of the columns are volatile
					return false;
				}
			}

			// figure out which projection expressions we are currently referencing
			set<idx_t> referenced_columns;
			for (auto &entry : column_references) {
				auto &column_binding = entry.first;
				if (column_binding.table_index == proj.table_index) {
					referenced_columns.insert(column_binding.column_index);
				}
			}
			// clear the list of referenced expressions and visit those columns
			column_references.clear();
			for (auto &col_idx : referenced_columns) {
				VisitExpression(&proj.expressions[col_idx]);
			}
			// continue into child
			child = *child.get().children[0];
			break;
		}
		case LogicalOperatorType::LOGICAL_FILTER: {
			// visit filter expressions - we need these columns
			VisitOperatorExpressions(child.get());
			// continue into child
			child = *child.get().children[0];
			break;
		}
		default:
			// unsupported operator for late materialization
			return false;
		}
	}
	auto &get = child.get().Cast<LogicalGet>();
	if (column_references.size() >= get.GetColumnIds().size()) {
		// we do not benefit from late materialization
		// we need all of the columns to compute the root node anyway (Top-N/Limit/etc)
		return false;
	}
	if (!get.function.late_materialization) {
		// this function does not support late materialization
		return false;
	}
	auto entry = get.virtual_columns.find(COLUMN_IDENTIFIER_ROW_ID);
	if (entry == get.virtual_columns.end()) {
		throw InternalException("Table function supports late materialization but does not expose a rowid column");
	}
	row_id_type = entry->second.type;
	// we benefit from late materialization
	// we need to transform this plan into a semi-join with the row-id
	// we need to ensure the operator returns exactly the same column bindings as before

	// construct the LHS from the LogicalGet
	auto lhs = ConstructLHS(get);
	// insert the row-id column on the left hand side
	auto &lhs_get = *lhs;
	auto lhs_index = lhs_get.table_index;
	auto lhs_columns = lhs_get.GetColumnIds().size();
	auto lhs_row_idx = GetOrInsertRowId(lhs_get);
	ColumnBinding lhs_binding(lhs_index, lhs_row_idx);

	// after constructing the LHS but before constructing the RHS we construct the final projections/orders
	// - we do this before constructing the RHS because that alter the original plan
	vector<unique_ptr<Expression>> final_proj_list;
	// construct the final projection list from either (1) the root projection, or (2) the logical get
	if (!source_operators.empty()) {
		// construct the columns from the root projection
		auto &root_proj = source_operators[0].get();
		for (auto &expr : root_proj.expressions) {
			final_proj_list.push_back(expr->Copy());
		}
		// now we need to "flatten" the projection list by traversing the set of projections and inlining them
		for (idx_t i = 0; i < source_operators.size(); i++) {
			auto &next_operator = i + 1 < source_operators.size() ? source_operators[i + 1].get() : lhs_get;
			for (auto &expr : final_proj_list) {
				ReplaceExpressionReferences(next_operator, expr);
			}
		}
	} else {
		// if we have no projection directly construct the columns from the root get
		for (idx_t i = 0; i < lhs_columns; i++) {
			final_proj_list.push_back(GetExpression(lhs_get, i));
		}
	}

	// we need to re-order again at the end
	vector<BoundOrderByNode> final_orders;
	auto root_type = op->type;
	if (root_type == LogicalOperatorType::LOGICAL_TOP_N) {
		// for top-n we need to re-order by the top-n conditions
		auto &top_n = op->Cast<LogicalTopN>();
		for (auto &order : top_n.orders) {
			auto expr = order.expression->Copy();
			final_orders.emplace_back(order.type, order.null_order, std::move(expr));
		}
	} else {
		// for limit/sample we order by row-id
		auto row_id_expr = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, lhs_binding);
		final_orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_LAST, std::move(row_id_expr));
	}

	// construct the RHS for the join
	// this is essentially the old pipeline, but with the `rowid` column added
	// note that the purpose of this optimization is to remove columns from the RHS
	// we don't do that here yet though - we do this in a later step using the RemoveUnusedColumns optimizer
	auto rhs_binding = ConstructRHS(op);

	// the final table index emitted must be the table index of the original operator
	// this ensures any upstream operators that refer to the original get will keep on referring to the correct columns
	auto final_index = rhs_binding.table_index;

	// we need to replace any references to "rhs_binding.table_index" in the rhs to a new table index
	rhs_binding.table_index = optimizer.binder.GenerateTableIndex();
	ReplaceTopLevelTableIndex(*op, rhs_binding.table_index);

	// construct a semi join between the lhs and rhs
	auto join = make_uniq<LogicalComparisonJoin>(JoinType::SEMI);
	join->children.push_back(std::move(lhs));
	join->children.push_back(std::move(op));
	JoinCondition condition;
	condition.comparison = ExpressionType::COMPARE_EQUAL;
	condition.left = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, lhs_binding);
	condition.right = make_uniq<BoundColumnRefExpression>("rowid", row_id_type, rhs_binding);
	join->conditions.push_back(std::move(condition));

	// push a projection that removes the row id again from the lhs
	// this is the final projection - so it should have the final table index
	auto proj_index = final_index;
	if (root_type == LogicalOperatorType::LOGICAL_TOP_N) {
		// for top-n we need to order on expressions, so we need to order AFTER the final projection
		auto proj = make_uniq<LogicalProjection>(proj_index, std::move(final_proj_list));
		if (join->has_estimated_cardinality) {
			proj->SetEstimatedCardinality(join->estimated_cardinality);
		}
		proj->children.push_back(std::move(join));

		for (auto &order : final_orders) {
			ReplaceTableReferences(*order.expression, proj_index);
		}
		auto order = make_uniq<LogicalOrder>(std::move(final_orders));
		if (proj->has_estimated_cardinality) {
			order->SetEstimatedCardinality(proj->estimated_cardinality);
		}
		order->children.push_back(std::move(proj));

		op = std::move(order);
	} else {
		// for limit/sample we order on row-id, so we need to order BEFORE the final projection
		// because the final projection removes row-ids
		auto order = make_uniq<LogicalOrder>(std::move(final_orders));
		if (join->has_estimated_cardinality) {
			order->SetEstimatedCardinality(join->estimated_cardinality);
		}
		order->children.push_back(std::move(join));

		auto proj = make_uniq<LogicalProjection>(proj_index, std::move(final_proj_list));
		if (order->has_estimated_cardinality) {
			proj->SetEstimatedCardinality(order->estimated_cardinality);
		}
		proj->children.push_back(std::move(order));

		op = std::move(proj);
	}

	// run the RemoveUnusedColumns optimizer to prune the (now) unused columns the plan
	RemoveUnusedColumns unused_optimizer(optimizer.binder, optimizer.context, true);
	unused_optimizer.VisitOperator(*op);
	return true;
}